

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<Fad<double>_>::Decompose_Cholesky(TPZMatrix<Fad<double>_> *this)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  int iVar6;
  int extraout_var;
  double *pdVar7;
  long lVar8;
  EVP_PKEY_CTX *pEVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  EVP_PKEY_CTX *pEVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  Fad<double> sum;
  Fad<double> tmp;
  Fad<double> local_128;
  undefined1 local_108 [16];
  EVP_PKEY_CTX *local_f8;
  double *pdStack_f0;
  double local_e8;
  undefined1 local_e0 [16];
  double *local_d0;
  double local_c8;
  Fad<double> local_c0;
  long local_a0;
  long local_98;
  TPZMatrix<Fad<double>_> *local_90;
  undefined1 local_88 [16];
  double *local_78;
  double local_70;
  Fad<double> *local_68;
  undefined8 uStack_60;
  Fad<double> *local_58;
  Fad<double> local_50;
  
  cVar5 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar5 != '\0') && (cVar5 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar5 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar5 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_a0 = CONCAT44(extraout_var,iVar6);
    if (local_a0 != 0 && -1 < extraout_var) {
      lVar8 = 0;
      local_90 = this;
      do {
        if (lVar8 != 0) {
          lVar16 = 0;
          do {
            local_108._0_8_ = 0.0;
            local_108._8_4_ = 0;
            local_f8 = (EVP_PKEY_CTX *)0x0;
            pdStack_f0 = (double *)0x0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_128,this,lVar8,lVar16);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_c0,this,lVar8,lVar16);
            local_e0._0_8_ = &local_128;
            local_e0._8_8_ = &local_c0;
            Fad<double>::operator+=
                      ((Fad<double> *)local_108,
                       (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_e0);
            Fad<double>::~Fad(&local_c0);
            Fad<double>::~Fad(&local_128);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_c0,this,lVar8);
            iVar6 = local_c0.dx_.num_elts;
            uVar3 = local_108._8_4_;
            local_128.val_ = local_c0.val_ - (double)local_108._0_8_;
            uVar2 = local_108._8_4_;
            if ((int)local_108._8_4_ < local_c0.dx_.num_elts) {
              uVar2 = local_c0.dx_.num_elts;
            }
            local_128.dx_.num_elts = 0;
            local_128.dx_.ptr_to_data = (double *)0x0;
            if (0 < (int)uVar2) {
              local_128.dx_.num_elts = uVar2;
              local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar2 * 8);
              uVar12 = 0;
              pdVar7 = local_c0.dx_.ptr_to_data;
              pEVar9 = local_f8;
              do {
                pdVar10 = pdVar7;
                if (iVar6 == 0) {
                  pdVar10 = &local_c0.defaultVal;
                }
                pEVar14 = pEVar9;
                if (uVar3 == 0) {
                  pEVar14 = (EVP_PKEY_CTX *)&pdStack_f0;
                }
                local_128.dx_.ptr_to_data[uVar12] = *pdVar10 - (double)*(double **)pEVar14;
                uVar12 = uVar12 + 1;
                pEVar9 = pEVar9 + 8;
                pdVar7 = pdVar7 + 1;
              } while (uVar2 != uVar12);
            }
            local_128.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar8,lVar8,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad(&local_c0);
            Fad<double>::~Fad((Fad<double> *)local_108);
            lVar16 = lVar16 + 1;
          } while (lVar16 != lVar8);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<double> *)local_e0,this,lVar8,lVar8);
        FadFuncSqrt<Fad<double>_>::FadFuncSqrt
                  ((FadFuncSqrt<Fad<double>_> *)&local_128,(Fad<double> *)local_e0);
        FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_108,
                   (FadFuncSqrt<Fad<double>_> *)&local_128);
        Fad<double>::~Fad(&local_128);
        dVar1 = (double)CONCAT44(local_108._12_4_,local_108._8_4_);
        if (dVar1 < 0.0) {
          local_c0.val_ = sqrt(dVar1);
        }
        else {
          local_c0.val_ = SQRT(dVar1);
        }
        local_c0.dx_.num_elts = 0;
        local_c0.dx_.ptr_to_data = (double *)0x0;
        if ((long)(int)(uint)local_f8 < 1) {
          local_c0.defaultVal = 0.0;
        }
        else {
          local_c0.dx_.num_elts = (uint)local_f8;
          uVar17 = (long)(int)(uint)local_f8 * 8;
          local_c0.dx_.ptr_to_data = (double *)operator_new__(uVar17);
          local_c0.defaultVal = 0.0;
          uVar12 = 0;
          do {
            pdVar7 = (double *)((long)pdStack_f0 + uVar12);
            if ((uint)local_f8 == 0) {
              pdVar7 = &local_e8;
            }
            dVar1 = *pdVar7;
            dVar18 = (double)CONCAT44(local_108._12_4_,local_108._8_4_);
            if (dVar18 < 0.0) {
              dVar18 = sqrt(dVar18);
            }
            else {
              dVar18 = SQRT(dVar18);
            }
            *(double *)((long)local_c0.dx_.ptr_to_data + uVar12) = dVar1 / (dVar18 + dVar18);
            uVar12 = uVar12 + 8;
          } while (uVar17 != uVar12);
        }
        Fad<double>::~Fad((Fad<double> *)(local_108 + 8));
        Fad<double>::~Fad((Fad<double> *)local_e0);
        this = local_90;
        (*(local_90->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (local_90,lVar8,lVar8,&local_c0);
        lVar16 = lVar8 + 1;
        local_98 = lVar16;
        if (lVar16 < local_a0) {
          do {
            if (lVar8 != 0) {
              lVar11 = 0;
              do {
                local_108._0_8_ = 0.0;
                local_108._8_4_ = 0;
                local_f8 = (EVP_PKEY_CTX *)0x0;
                pdStack_f0 = (double *)0x0;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_128,this,lVar8,lVar11);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          ((Fad<double> *)local_e0,this,lVar16,lVar11);
                local_88._0_8_ = &local_128;
                local_88._8_8_ = (Fad<double> *)local_e0;
                Fad<double>::operator+=
                          ((Fad<double> *)local_108,
                           (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_88);
                Fad<double>::~Fad((Fad<double> *)local_e0);
                Fad<double>::~Fad(&local_128);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          ((Fad<double> *)local_e0,this,lVar8,lVar16);
                uVar3 = local_108._8_4_;
                local_128.val_ = (double)local_e0._0_8_ - (double)local_108._0_8_;
                uVar4 = local_e0._8_4_;
                uVar2 = local_108._8_4_;
                if ((int)local_108._8_4_ < (int)local_e0._8_4_) {
                  uVar2 = local_e0._8_4_;
                }
                local_128.dx_.num_elts = 0;
                local_128.dx_.ptr_to_data = (double *)0x0;
                if (0 < (int)uVar2) {
                  local_128.dx_.num_elts = uVar2;
                  local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar2 * 8);
                  uVar12 = 0;
                  pdVar7 = local_d0;
                  pEVar9 = local_f8;
                  do {
                    pdVar10 = pdVar7;
                    if (uVar4 == 0) {
                      pdVar10 = &local_c8;
                    }
                    pEVar14 = pEVar9;
                    if (uVar3 == 0) {
                      pEVar14 = (EVP_PKEY_CTX *)&pdStack_f0;
                    }
                    local_128.dx_.ptr_to_data[uVar12] = *pdVar10 - (double)*(double **)pEVar14;
                    uVar12 = uVar12 + 1;
                    pEVar9 = pEVar9 + 8;
                    pdVar7 = pdVar7 + 1;
                  } while (uVar2 != uVar12);
                }
                this = local_90;
                local_128.defaultVal = 0.0;
                (*(local_90->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (local_90,lVar8,lVar16,&local_128);
                Fad<double>::~Fad(&local_128);
                Fad<double>::~Fad((Fad<double> *)local_e0);
                Fad<double>::~Fad((Fad<double> *)local_108);
                lVar11 = lVar11 + 1;
              } while (lVar11 != lVar8);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_108,this,lVar8,lVar8);
            uVar3 = local_108._8_4_;
            local_50.val_ = (double)local_108._0_8_;
            local_50.dx_.num_elts = local_108._8_4_;
            local_50.dx_.ptr_to_data = (double *)0x0;
            if ((long)(int)local_108._8_4_ != 0) {
              uVar12 = (long)(int)local_108._8_4_ * 8;
              if ((int)local_108._8_4_ < 0) {
                uVar12 = 0xffffffffffffffff;
              }
              local_50.dx_.ptr_to_data = (double *)operator_new__(uVar12);
              MEM_CPY<double>::copy
                        ((MEM_CPY<double> *)local_50.dx_.ptr_to_data,local_f8,
                         (EVP_PKEY_CTX *)(ulong)(uint)uVar3);
            }
            local_68 = (Fad<double> *)((ulong)local_50.val_ & 0x7fffffffffffffff);
            uStack_60 = 0;
            local_50.defaultVal = (double)pdStack_f0;
            Fad<double>::~Fad(&local_50);
            if ((double)local_68 < 1e-12) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_e0,this,lVar8,lVar16);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_88,this,lVar8,lVar8);
            local_128.val_ = (double)local_e0._0_8_ / (double)local_88._0_8_;
            uVar3 = local_e0._8_4_;
            uVar4 = local_88._8_4_;
            uVar2 = local_88._8_4_;
            if ((int)local_88._8_4_ < (int)local_e0._8_4_) {
              uVar2 = local_e0._8_4_;
            }
            local_128.dx_.num_elts = 0;
            local_128.dx_.ptr_to_data = (double *)0x0;
            if (0 < (int)uVar2) {
              local_58 = (Fad<double> *)local_88._0_8_;
              local_68 = (Fad<double> *)local_e0._0_8_;
              local_128.dx_.num_elts = uVar2;
              local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar2 * 8);
              uVar12 = 0;
              pdVar7 = local_d0;
              pdVar10 = local_78;
              do {
                pdVar13 = pdVar7;
                if (uVar3 == 0) {
                  pdVar13 = &local_c8;
                }
                pdVar15 = pdVar10;
                if (uVar4 == 0) {
                  pdVar15 = &local_70;
                }
                local_128.dx_.ptr_to_data[uVar12] =
                     (*pdVar13 * (double)local_58 - *pdVar15 * (double)local_68) /
                     ((double)local_58 * (double)local_58);
                uVar12 = uVar12 + 1;
                pdVar10 = pdVar10 + 1;
                pdVar7 = pdVar7 + 1;
              } while (uVar2 != uVar12);
            }
            local_128.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar8,lVar16,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad((Fad<double> *)local_88);
            Fad<double>::~Fad((Fad<double> *)local_e0);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_128,this,lVar8,lVar16);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar16,lVar8,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad((Fad<double> *)local_108);
            lVar16 = lVar16 + 1;
          } while (lVar16 < local_a0);
        }
        Fad<double>::~Fad(&local_c0);
        lVar8 = local_98;
      } while (local_98 != local_a0);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}